

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O1

void __thiscall FLinePortalTraverse::AddLineIntercepts(FLinePortalTraverse *this,int bx,int by)

{
  double dVar1;
  double dVar2;
  double dVar3;
  line_t_conflict *plVar4;
  FPortalBlock *pFVar5;
  intercept_t *piVar6;
  intercept_t *piVar7;
  FPortalBlock *pFVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  divline_t *v2;
  double dVar12;
  divline_t dl;
  divline_t local_60;
  double local_40;
  divline_t *local_38;
  
  pFVar8 = PortalBlockmap.data.Array;
  if ((((-1 < by) && (-1 < bx)) && (by < bmapheight)) &&
     ((bx < bmapwidth &&
      (iVar10 = by * PortalBlockmap.dx + bx,
      PortalBlockmap.data.Array[iVar10].portallines.Count != 0)))) {
    pFVar5 = PortalBlockmap.data.Array + iVar10;
    v2 = &(this->super_FPathTraverse).trace;
    uVar11 = 0;
    do {
      plVar4 = (pFVar5->portallines).Array[uVar11];
      if (plVar4->validcount != validcount) {
        local_60.x = (plVar4->v1->p).X;
        local_60.y = (plVar4->v1->p).Y;
        dVar12 = (this->super_FPathTraverse).trace.x;
        dVar1 = (this->super_FPathTraverse).trace.y;
        dVar2 = (this->super_FPathTraverse).trace.dx;
        dVar3 = (this->super_FPathTraverse).trace.dy;
        if (1.52587890625e-05 < (dVar12 - local_60.x) * dVar3 + (local_60.y - dVar1) * dVar2 ==
            (dVar12 - (plVar4->v2->p).X) * dVar3 + ((plVar4->v2->p).Y - dVar1) * dVar2 <=
            1.52587890625e-05) {
          local_60.dx = (plVar4->delta).X;
          local_60.dy = (plVar4->delta).Y;
          dVar1 = (this->super_FPathTraverse).trace.y;
          if ((((local_60.x - dVar12) * local_60.dy + (dVar1 - local_60.y) * local_60.dx <=
                1.52587890625e-05) &&
              (1.52587890625e-05 <
               (local_60.x - (dVar12 + (this->super_FPathTraverse).trace.dx)) * local_60.dy +
               ((dVar1 + (this->super_FPathTraverse).trace.dy) - local_60.y) * local_60.dx)) &&
             ((dVar12 = P_InterceptVector(v2,&local_60), 0.0 <= dVar12 && (dVar12 <= 1.0)))) {
            local_40 = dVar12;
            local_38 = v2;
            TArray<intercept_t,_intercept_t>::Grow(&FPathTraverse::intercepts,1);
            piVar7 = FPathTraverse::intercepts.Array;
            uVar9 = (ulong)FPathTraverse::intercepts.Count;
            FPathTraverse::intercepts.Array[uVar9].frac = local_40;
            piVar6 = piVar7 + uVar9;
            piVar6->isaline = true;
            piVar6->done = false;
            piVar7[uVar9].d.line = plVar4;
            FPathTraverse::intercepts.Count = FPathTraverse::intercepts.Count + 1;
            v2 = local_38;
          }
        }
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < pFVar8[iVar10].portallines.Count);
  }
  return;
}

Assistant:

void FLinePortalTraverse::AddLineIntercepts(int bx, int by)
{
	if (by < 0 || by >= bmapheight || bx < 0 || bx >= bmapwidth) return;

	FPortalBlock &block = PortalBlockmap(bx, by);

	for (unsigned i = 0; i<block.portallines.Size(); i++)
	{
		line_t *ld = block.portallines[i];
		double frac;
		divline_t dl;

		if (ld->validcount == validcount) continue;	// already processed

		if (P_PointOnDivlineSide (ld->v1->fPos(), &trace) ==
			P_PointOnDivlineSide (ld->v2->fPos(), &trace))
		{
			continue;		// line isn't crossed
		}
		P_MakeDivline (ld, &dl);
		if (P_PointOnDivlineSide(trace.x, trace.y, &dl) != 0 ||
			P_PointOnDivlineSide(trace.x + trace.dx, trace.y + trace.dy, &dl) != 1)
		{
			continue;		// line isn't crossed from the front side
		}

		// hit the line
		P_MakeDivline(ld, &dl);
		frac = P_InterceptVector(&trace, &dl);
		if (frac < 0 || frac > 1.) continue;	// behind source

		intercept_t newintercept;

		newintercept.frac = frac;
		newintercept.isaline = true;
		newintercept.done = false;
		newintercept.d.line = ld;
		intercepts.Push(newintercept);
	}
}